

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O1

PrimInfo *
embree::avx::createPrimRefArrayGrids
          (PrimInfo *__return_storage_ptr__,GridMesh *mesh,mvector<PrimRef> *prims,
          mvector<SubGridBuildData> *sgrids)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  SubGridBuildData *ptr;
  PrimRef *ptr_00;
  MemoryMonitorInterface *pMVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  char cVar8;
  int iVar9;
  task *ptVar10;
  SubGridBuildData *pSVar11;
  PrimRef *pPVar12;
  long lVar13;
  runtime_error *prVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  size_t sVar17;
  ulong uVar18;
  _func_int **pp_Var19;
  ulong uVar20;
  size_t sVar21;
  _func_int **pp_Var22;
  PrimInfo *pPVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  undefined1 auVar29 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  size_t taskCount;
  small_object_allocator alloc;
  uint geomID_;
  task_group_context context;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  _func_int **local_2960;
  PrimInfo *local_2958;
  ulong local_2950;
  long local_2948;
  long **local_2940;
  task_traits local_2938;
  undefined4 local_292c;
  GridMesh *local_2928;
  GridMesh **local_2920;
  mvector<PrimRef> *local_2918;
  mvector<SubGridBuildData> *local_2910;
  undefined4 *local_2908;
  long *local_2900;
  ulong *local_28f8;
  _func_int ***local_28f0;
  undefined1 *local_28e8;
  GridMesh ***local_28e0;
  undefined8 local_28d8;
  undefined4 local_28d0;
  wait_context local_28c8;
  task_group_context local_28b8;
  undefined1 local_2838 [5184];
  undefined1 local_13f8 [5064];
  
  local_2920 = &local_2928;
  local_2918 = (mvector<PrimRef> *)&local_292c;
  local_292c = 0xffffffff;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  local_2950 = (ulong)(mesh->super_Geometry).numPrimitives;
  local_2948 = 0;
  local_2958 = __return_storage_ptr__;
  local_2928 = mesh;
  iVar9 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  pp_Var22 = (_func_int **)((local_2950 - local_2948) + 0x3ff >> 10);
  if ((_func_int **)(long)iVar9 < pp_Var22) {
    pp_Var22 = (_func_int **)(long)iVar9;
  }
  pp_Var19 = (_func_int **)0x40;
  if (pp_Var22 < (_func_int **)0x40) {
    pp_Var19 = pp_Var22;
  }
  local_28f0 = &local_2960;
  local_28e8 = local_2838;
  local_28e0 = &local_2920;
  local_28b8.my_version = proxy_support;
  local_28b8.my_traits = (context_traits)0x4;
  local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_28b8.my_name = CUSTOM_CTX;
  local_2960 = pp_Var19;
  local_2900 = &local_2948;
  local_28f8 = &local_2950;
  tbb::detail::r1::initialize(&local_28b8);
  local_2940 = &local_2900;
  if (pp_Var22 != (_func_int **)0x0) {
    local_2938.m_version_and_traits = 0;
    ptVar10 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2938,0xc0);
    ptVar10->m_reserved[2] = 0;
    ptVar10->m_reserved[3] = 0;
    ptVar10->m_reserved[4] = 0;
    ptVar10->m_reserved[5] = 0;
    (ptVar10->super_task_traits).m_version_and_traits = 0;
    ptVar10->m_reserved[0] = 0;
    ptVar10->m_reserved[1] = 0;
    ptVar10->m_reserved[2] = 0;
    ptVar10->_vptr_task = (_func_int **)&PTR__task_0221c468;
    ptVar10[1]._vptr_task = pp_Var19;
    ptVar10[1].super_task_traits.m_version_and_traits = 0;
    ptVar10[1].m_reserved[0] = 1;
    ptVar10[1].m_reserved[1] = (uint64_t)&local_2940;
    ptVar10[1].m_reserved[2] = 0;
    ptVar10[1].m_reserved[3] = 1;
    iVar9 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar10[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar10[2]._vptr_task + 4) = 5;
    ptVar10[1].m_reserved[5] = ((long)iVar9 & 0x3fffffffffffffffU) * 2;
    ptVar10[2].super_task_traits.m_version_and_traits = local_2938.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar10[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar10,&local_28b8,&local_28c8,&local_28b8);
  }
  cVar8 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
  pPVar23 = local_2958;
  if (cVar8 != '\0') {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"task cancelled");
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_28b8);
  if (local_2960 == (_func_int **)0x0) {
    sVar21 = 0;
    aVar24.m128[2] = INFINITY;
    aVar24._0_8_ = 0x7f8000007f800000;
    aVar24.m128[3] = INFINITY;
    aVar26.m128[2] = -INFINITY;
    aVar26._0_8_ = 0xff800000ff800000;
    aVar26.m128[3] = -INFINITY;
    sVar17 = 0;
    aVar28 = aVar24;
    aVar27 = aVar26;
  }
  else {
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    aVar24.m128[2] = INFINITY;
    aVar24._0_8_ = 0x7f8000007f800000;
    aVar24.m128[3] = INFINITY;
    aVar26.m128[2] = -INFINITY;
    aVar26._0_8_ = 0xff800000ff800000;
    aVar26.m128[3] = -INFINITY;
    pauVar16 = (undefined1 (*) [16])local_13f8;
    pp_Var22 = local_2960;
    aVar28 = aVar24;
    aVar27 = aVar26;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar16 + -4) = aVar28;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar16 + -3) = aVar27;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar16 + -2) = aVar24;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar16 + -1) = aVar26;
      *pauVar16 = auVar29._0_16_;
      aVar28.m128 = (__m128)vminps_avx(aVar28.m128,pauVar16[-0x144]);
      aVar27.m128 = (__m128)vmaxps_avx(aVar27.m128,pauVar16[-0x143]);
      aVar24.m128 = (__m128)vminps_avx(aVar24.m128,pauVar16[-0x142]);
      aVar26.m128 = (__m128)vmaxps_avx(aVar26.m128,pauVar16[-0x141]);
      auVar25 = vpaddq_avx(auVar29._0_16_,pauVar16[-0x140]);
      auVar29 = ZEXT1664(auVar25);
      pauVar16 = pauVar16 + 5;
      pp_Var22 = (_func_int **)((long)pp_Var22 + -1);
    } while (pp_Var22 != (_func_int **)0x0);
    sVar17 = vpextrq_avx(auVar25,1);
    sVar21 = auVar25._0_8_;
  }
  (pPVar23->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar28;
  (pPVar23->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar27;
  (pPVar23->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar24;
  (pPVar23->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar26;
  pPVar23->begin = sVar21;
  pPVar23->end = sVar17;
  uVar18 = sVar17 - sVar21;
  uVar15 = sgrids->size_alloced;
  uVar20 = uVar15;
  if ((uVar15 < uVar18) && (uVar20 = uVar18, uVar7 = uVar15, uVar15 != 0)) {
    while (uVar20 = uVar7, uVar20 < uVar18) {
      uVar7 = uVar20 * 2 + (ulong)(uVar20 * 2 == 0);
    }
  }
  if (uVar18 < sgrids->size_active) {
    sgrids->size_active = uVar18;
  }
  if (uVar15 == uVar20) {
    sgrids->size_active = uVar18;
  }
  else {
    ptr = sgrids->items;
    if (uVar20 != 0) {
      pMVar3 = (sgrids->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar20 * 8,0);
    }
    uVar15 = uVar20 * 8;
    if (uVar15 < 0x1c00000) {
      pSVar11 = (SubGridBuildData *)alignedMalloc(uVar15,4);
    }
    else {
      pSVar11 = (SubGridBuildData *)os_malloc(uVar15,&(sgrids->alloc).hugepages);
    }
    sgrids->items = pSVar11;
    if (sgrids->size_active != 0) {
      uVar15 = 0;
      do {
        sgrids->items[uVar15] = ptr[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar15 < sgrids->size_active);
    }
    sVar21 = sgrids->size_alloced;
    if (ptr != (SubGridBuildData *)0x0) {
      if (sVar21 * 8 < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,sVar21 * 8,(sgrids->alloc).hugepages);
      }
    }
    if (sVar21 != 0) {
      pMVar3 = (sgrids->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar21 * -8,1);
    }
    sgrids->size_active = uVar18;
    sgrids->size_alloced = uVar20;
    pPVar23 = local_2958;
  }
  uVar15 = prims->size_alloced;
  uVar20 = uVar15;
  if ((uVar15 < uVar18) && (uVar20 = uVar18, uVar7 = uVar15, uVar15 != 0)) {
    while (uVar20 = uVar7, uVar20 < uVar18) {
      uVar7 = uVar20 * 2 + (ulong)(uVar20 * 2 == 0);
    }
  }
  if (uVar18 < prims->size_active) {
    prims->size_active = uVar18;
  }
  if (uVar15 == uVar20) {
    prims->size_active = uVar18;
  }
  else {
    ptr_00 = prims->items;
    if (uVar20 != 0) {
      pMVar3 = (prims->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar20 << 5,0);
    }
    sVar21 = uVar20 << 5;
    if (sVar21 < 0x1c00000) {
      pPVar12 = (PrimRef *)alignedMalloc(sVar21,0x20);
    }
    else {
      pPVar12 = (PrimRef *)os_malloc(sVar21,&(prims->alloc).hugepages);
    }
    prims->items = pPVar12;
    if (prims->size_active != 0) {
      lVar13 = 0;
      uVar15 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(ptr_00->lower).field_0 + lVar13);
        uVar4 = puVar1[1];
        uVar5 = puVar1[2];
        uVar6 = puVar1[3];
        puVar2 = (undefined8 *)((long)&(prims->items->lower).field_0 + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        puVar2[2] = uVar5;
        puVar2[3] = uVar6;
        uVar15 = uVar15 + 1;
        lVar13 = lVar13 + 0x20;
      } while (uVar15 < prims->size_active);
    }
    sVar21 = prims->size_alloced;
    if (ptr_00 != (PrimRef *)0x0) {
      if (sVar21 << 5 < 0x1c00000) {
        alignedFree(ptr_00);
      }
      else {
        os_free(ptr_00,sVar21 << 5,(prims->alloc).hugepages);
      }
    }
    if (sVar21 != 0) {
      pMVar3 = (prims->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar21 * -0x20,1);
    }
    prims->size_active = uVar18;
    prims->size_alloced = uVar20;
    pPVar23 = local_2958;
  }
  local_2950 = (ulong)(local_2928->super_Geometry).numPrimitives;
  local_2920 = &local_2928;
  local_2908 = &local_292c;
  local_2948 = 0;
  local_2918 = prims;
  local_2910 = sgrids;
  iVar9 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  pp_Var22 = (_func_int **)((local_2950 - local_2948) + 0x3ff >> 10);
  if ((_func_int **)(long)iVar9 < pp_Var22) {
    pp_Var22 = (_func_int **)(long)iVar9;
  }
  pp_Var19 = (_func_int **)0x40;
  if (pp_Var22 < (_func_int **)0x40) {
    pp_Var19 = pp_Var22;
  }
  local_2900 = &local_2948;
  local_28f8 = &local_2950;
  local_28f0 = &local_2960;
  local_28e8 = local_2838;
  local_28e0 = &local_2920;
  local_28b8.my_version = proxy_support;
  local_28b8.my_traits = (context_traits)0x4;
  local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_28b8.my_name = CUSTOM_CTX;
  local_2960 = pp_Var19;
  tbb::detail::r1::initialize(&local_28b8);
  local_2940 = &local_2900;
  if (pp_Var22 != (_func_int **)0x0) {
    local_2938.m_version_and_traits = 0;
    ptVar10 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2938,0xc0);
    ptVar10->m_reserved[2] = 0;
    ptVar10->m_reserved[3] = 0;
    ptVar10->m_reserved[4] = 0;
    ptVar10->m_reserved[5] = 0;
    (ptVar10->super_task_traits).m_version_and_traits = 0;
    ptVar10->m_reserved[0] = 0;
    ptVar10->m_reserved[1] = 0;
    ptVar10->m_reserved[2] = 0;
    ptVar10->_vptr_task = (_func_int **)&PTR__task_0221c4b0;
    ptVar10[1]._vptr_task = pp_Var19;
    ptVar10[1].super_task_traits.m_version_and_traits = 0;
    ptVar10[1].m_reserved[0] = 1;
    ptVar10[1].m_reserved[1] = (uint64_t)&local_2940;
    ptVar10[1].m_reserved[2] = 0;
    ptVar10[1].m_reserved[3] = 1;
    iVar9 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar10[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar10[2]._vptr_task + 4) = 5;
    ptVar10[1].m_reserved[5] = ((long)iVar9 & 0x3fffffffffffffffU) * 2;
    ptVar10[2].super_task_traits.m_version_and_traits = local_2938.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar10[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar10,&local_28b8,&local_28c8,&local_28b8);
  }
  cVar8 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
  if (cVar8 != '\0') {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar14,"task cancelled");
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_28b8);
  auVar25 = ZEXT816(0) << 0x40;
  if (local_2960 == (_func_int **)0x0) {
    aVar28.m128[2] = INFINITY;
    aVar28._0_8_ = 0x7f8000007f800000;
    aVar28.m128[3] = INFINITY;
    aVar27.m128[2] = -INFINITY;
    aVar27._0_8_ = 0xff800000ff800000;
    aVar27.m128[3] = -INFINITY;
    aVar30 = aVar28;
    aVar26 = aVar27;
  }
  else {
    aVar27.m128[2] = -INFINITY;
    aVar27._0_8_ = 0xff800000ff800000;
    aVar27.m128[3] = -INFINITY;
    aVar30.m128[2] = INFINITY;
    aVar30._0_8_ = 0x7f8000007f800000;
    aVar30.m128[3] = INFINITY;
    pauVar16 = (undefined1 (*) [16])local_13f8;
    aVar26 = aVar27;
    aVar28 = aVar30;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar16 + -4) = aVar28;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar16 + -3) = aVar27;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar16 + -2) = aVar30;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pauVar16 + -1) = aVar26;
      *pauVar16 = auVar25;
      aVar28.m128 = (__m128)vminps_avx(aVar28.m128,pauVar16[-0x144]);
      aVar27.m128 = (__m128)vmaxps_avx(aVar27.m128,pauVar16[-0x143]);
      aVar30.m128 = (__m128)vminps_avx(aVar30.m128,pauVar16[-0x142]);
      aVar26.m128 = (__m128)vmaxps_avx(aVar26.m128,pauVar16[-0x141]);
      auVar25 = vpaddq_avx(auVar25,pauVar16[-0x140]);
      pauVar16 = pauVar16 + 5;
      local_2960 = (_func_int **)((long)local_2960 + -1);
    } while (local_2960 != (_func_int **)0x0);
  }
  (pPVar23->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar28;
  (pPVar23->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar27;
  (pPVar23->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar30;
  (pPVar23->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar26;
  pPVar23->begin = auVar25._0_8_;
  pPVar23->end = auVar25._8_8_;
  return pPVar23;
}

Assistant:

PrimInfo createPrimRefArrayGrids(GridMesh* mesh, mvector<PrimRef>& prims, mvector<SubGridBuildData>& sgrids)
    {
      unsigned int geomID_ = std::numeric_limits<unsigned int>::max ();

      PrimInfo pinfo(empty);
      size_t numPrimitives = 0;
      
      ParallelPrefixSumState<PrimInfo> pstate;
      /* iterate over all grids in a single mesh */
      pinfo = parallel_prefix_sum( pstate, size_t(0), mesh->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo
                                   {
                                     PrimInfo pinfo(empty);
                                     for (size_t j=r.begin(); j<r.end(); j++)
                                     {
                                       if (!mesh->valid(j)) continue;
                                       BBox3fa bounds = empty;
                                       const PrimRef prim(bounds,geomID_,unsigned(j));
                                       pinfo.add_center2(prim,mesh->getNumSubGrids(j));
                                     }
                                     return pinfo;
                                   }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      numPrimitives = pinfo.size();
      /* resize arrays */
      sgrids.resize(numPrimitives); 
      prims.resize(numPrimitives); 

      /* second run to fill primrefs and SubGridBuildData arrays */
      pinfo = parallel_prefix_sum( pstate, size_t(0), mesh->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
        return mesh->createPrimRefArray(prims,sgrids,r,base.size(),geomID_);
      }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      return pinfo;
    }